

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O2

void __thiscall DBaseStatusBar::DrawMessages(DBaseStatusBar *this,int layer,int bottom)

{
  uint uVar1;
  DHUDMessage *this_00;
  DHUDMessage *pDVar2;
  uint uVar3;
  
  this_00 = GC::ReadBarrier<DHUDMessage>((DHUDMessage **)(this->Messages + layer));
  uVar3 = 0;
  if (automapactive != false) {
    uVar3 = viewactive + 2 + (uint)viewactive;
  }
  uVar1 = (uint)viewactive;
  while (this_00 != (DHUDMessage *)0x0) {
    pDVar2 = GC::ReadBarrier<DHUDMessage>((DHUDMessage **)&this_00->Next);
    DHUDMessage::Draw(this_00,bottom,uVar3 | uVar1);
    this_00 = pDVar2;
  }
  return;
}

Assistant:

void DBaseStatusBar::DrawMessages (int layer, int bottom)
{
	DHUDMessage *msg = Messages[layer];
	int visibility = 0;

	if (viewactive)
	{
		visibility |= HUDMSG_NotWith3DView;
	}
	if (automapactive)
	{
		visibility |= viewactive ? HUDMSG_NotWithOverlayMap : HUDMSG_NotWithFullMap;
	}
	while (msg)
	{
		DHUDMessage *next = msg->Next;
		msg->Draw (bottom, visibility);
		msg = next;
	}
}